

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O0

void __thiscall manager::Manager<uttt::IBoard>::~Manager(Manager<uttt::IBoard> *this)

{
  bool bVar1;
  reference ppVar2;
  undefined8 *in_RDI;
  pair<const_long_long,_manager::Bot<uttt::IBoard>_*> it;
  iterator __end0;
  iterator __begin0;
  unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
  *__range2;
  unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
  *in_stack_ffffffffffffffb8;
  Bot<uttt::IBoard> *this_00;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false> local_20;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false> local_18;
  undefined8 *local_10;
  
  local_10 = in_RDI + 1;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false,_false>
                          *)0x231dd9);
    this_00 = ppVar2->second;
    if (this_00 != (Bot<uttt::IBoard> *)0x0) {
      Bot<uttt::IBoard>::~Bot(this_00);
      operator_delete(this_00);
    }
    std::__detail::
    _Node_iterator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false,_false>
                *)this_00);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI);
  }
  std::
  unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
  ::~unordered_map((unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
                    *)0x231e45);
  return;
}

Assistant:

Manager<IGame>::~Manager()
{
    for (auto it : bots)
        delete it.second;
    delete game;
}